

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Scene::render_splines_at
          (Scene *this,double time,bool pretty,bool useCapsuleRadius)

{
  SceneObject *pSVar1;
  bool bVar2;
  reference ppSVar3;
  Mesh *local_120;
  SceneObject *obj_3;
  iterator __end2_3;
  iterator __begin2_3;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2_3;
  GLfloat white [4];
  SceneObject *obj_2;
  iterator __end2_2;
  iterator __begin2_2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2_2;
  Mesh *mesh;
  SceneObject *obj_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2_1;
  double local_80;
  double local_78;
  Vector3D local_70;
  Vector3D local_58;
  SceneObject *local_40;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2;
  bool useCapsuleRadius_local;
  bool pretty_local;
  double time_local;
  Scene *this_local;
  
  __end2 = std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::begin(&this->objects);
  obj = (SceneObject *)
        std::
        set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
        ::end(&this->objects);
  while (bVar2 = std::operator!=(&__end2,(_Self *)&obj), bVar2) {
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(&__end2);
    local_40 = *ppSVar3;
    Spline<CMU462::Vector3D>::evaluate(&local_58,&local_40->positions,time,0);
    (local_40->position).x = local_58.x;
    (local_40->position).y = local_58.y;
    (local_40->position).z = local_58.z;
    Spline<CMU462::Vector3D>::evaluate(&local_70,&local_40->rotations,time,0);
    (local_40->rotation).x = local_70.x;
    (local_40->rotation).y = local_70.y;
    (local_40->rotation).z = local_70.z;
    Spline<CMU462::Vector3D>::evaluate((Vector3D *)&__range2_1,&local_40->scales,time,0);
    (local_40->scale).x = (double)__range2_1;
    (local_40->scale).y = local_80;
    (local_40->scale).z = local_78;
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end2);
  }
  __end2_1 = std::
             set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
             ::begin(&this->objects);
  obj_1 = (SceneObject *)
          std::
          set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
          ::end(&this->objects);
  while (bVar2 = std::operator!=(&__end2_1,(_Self *)&obj_1), bVar2) {
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                        (&__end2_1);
    if (*ppSVar3 == (SceneObject *)0x0) {
      local_120 = (Mesh *)0x0;
    }
    else {
      local_120 = (Mesh *)__dynamic_cast(*ppSVar3,&SceneObject::typeinfo,&Mesh::typeinfo,0);
    }
    if (local_120 != (Mesh *)0x0) {
      Mesh::linearBlendSkinning(local_120,useCapsuleRadius);
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end2_1);
  }
  __end2_2 = std::
             set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
             ::begin(&this->objects);
  obj_2 = (SceneObject *)
          std::
          set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
          ::end(&this->objects);
  while (bVar2 = std::operator!=(&__end2_2,(_Self *)&obj_2), bVar2) {
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                        (&__end2_2);
    pSVar1 = *ppSVar3;
    __range2_3 = (set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
                  *)0x3f8000003f800000;
    white[0] = 1.0;
    white[1] = 1.0;
    if (((pSVar1->isVisible & 1U) == 0) || ((pSVar1->isGhosted & 1U) != 0)) {
      if (((pSVar1->isVisible & 1U) != 0) && ((pSVar1->isGhosted & 1U) != 0)) {
        glEnable(0xbc0);
        glAlphaFunc(0x3f800000,0x206);
        (*pSVar1->_vptr_SceneObject[3])();
        glDisable(0xbc0);
      }
    }
    else if (pretty) {
      (*pSVar1->_vptr_SceneObject[2])();
    }
    else {
      (*pSVar1->_vptr_SceneObject[1])();
    }
    glLightfv(0x4000,0x1201,&__range2_3);
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end2_2);
  }
  __end2_3 = std::
             set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
             ::begin(&this->objects);
  obj_3 = (SceneObject *)
          std::
          set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
          ::end(&this->objects);
  while (bVar2 = std::operator!=(&__end2_3,(_Self *)&obj_3), bVar2) {
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                        (&__end2_3);
    pSVar1 = *ppSVar3;
    if (((pSVar1->isVisible & 1U) != 0) && ((pSVar1->isGhosted & 1U) != 0)) {
      glEnable(0xbc0);
      glAlphaFunc(0x3f800000,0x201);
      glDepthMask(0);
      (*pSVar1->_vptr_SceneObject[3])();
      glDisable(0xbc0);
      glDepthMask(1);
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end2_3);
  }
  return;
}

Assistant:

void Scene::render_splines_at(double time, bool pretty, bool useCapsuleRadius)
{
  // Update splines
  for (SceneObject *obj : objects)
  {
    obj->position = obj->positions.evaluate(time);
    obj->rotation = obj->rotations.evaluate(time);
    obj->scale = obj->scales.evaluate(time);
  }

  // Perform linear blend skinning before rendering
  for (SceneObject *obj : objects)
  {
    Mesh* mesh = dynamic_cast<Mesh*>(obj);
    if (mesh != nullptr)
    {
      mesh->linearBlendSkinning(useCapsuleRadius);
    }
  }
  
  // draw the scene twice using alpha test
  for (SceneObject *obj : objects)
  {
    GLfloat white[4] = { 1., 1., 1., 1. };
    if (obj->isVisible && !obj->isGhosted)
    {
      (pretty) ? (obj->draw_pretty()) : (obj->draw());
    }
    else if (obj->isVisible && obj->isGhosted)
    {
      glEnable(GL_ALPHA_TEST);
      glAlphaFunc(GL_GEQUAL, 1);
      obj->drawGhost();
      glDisable(GL_ALPHA_TEST);
    }
    glLightfv(GL_LIGHT0, GL_DIFFUSE, white);
  }

  for (SceneObject *obj : objects)
  {
    if (obj->isVisible && obj->isGhosted)
    {
      glEnable(GL_ALPHA_TEST);
      glAlphaFunc(GL_LESS, 1);
      glDepthMask(GL_FALSE);
      obj->drawGhost();
      glDisable(GL_ALPHA_TEST);
      glDepthMask(GL_TRUE);
    }
  }
}